

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<unsigned_int,unsigned_int>(void)

{
  int local_40;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_3c;
  int local_38;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  int local_30;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  int local_28;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  int local_20;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1c;
  int local_18;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  
  local_18 = 3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_14,&local_18);
  if (local_14.m_int != 2) {
    local_20 = 4;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_1c,&local_20);
    if (local_1c.m_int != 5) {
      local_28 = 6;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_24,&local_28);
      local_30 = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2c,&local_30);
      if (local_24.m_int != local_2c.m_int) {
        local_38 = 1;
        SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_34,&local_38);
        if (local_34.m_int == 0) {
          local_40 = 0;
          SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_3c,&local_40);
          return local_3c.m_int != 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}